

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool duckdb_miniz::mz_zip_reader_extract_to_callback
                  (mz_zip_archive *pZip,mz_uint file_index,mz_file_write_func pCallback,
                  void *pOpaque,mz_uint flags)

{
  void *pvVar1;
  mz_bool mVar2;
  tinfl_status tVar3;
  size_t sVar4;
  mz_uint8 *pOut_buf_start;
  undefined4 extraout_var;
  size_t sVar6;
  mz_ulong mVar7;
  mz_zip_error mVar8;
  mz_uint8 *ptr;
  mz_uint64 mVar9;
  mz_uint64 mVar10;
  ulong uVar11;
  mz_uint8 *pOut_buf_next;
  mz_uint64 mVar12;
  uint uVar13;
  bool bVar14;
  size_t out_buf_size;
  size_t in_buf_size;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  tinfl_decompressor inflator;
  ulong local_2ff0;
  ulong local_2fe8;
  long local_2fe0;
  mz_uint64 local_2fc8;
  size_t local_2fb0;
  size_t local_2fa8;
  undefined8 local_2fa0;
  int local_2f98 [6];
  ushort local_2f7e;
  ushort local_2f7c;
  mz_zip_archive_file_stat local_2f78;
  tinfl_decompressor local_2b28;
  undefined8 uVar5;
  
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  if (((pCallback == (mz_file_write_func)0x0) || (pZip->m_pState == (mz_zip_internal_state *)0x0))
     || (pZip->m_pRead == (mz_file_read_func)0x0)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
      return 0;
    }
    return 0;
  }
  mVar2 = mz_zip_reader_file_stat(pZip,file_index,&local_2f78);
  if (mVar2 == 0) {
    return 0;
  }
  if (local_2f78.m_is_directory != 0) {
    return 1;
  }
  if (local_2f78.m_comp_size == 0) {
    return 1;
  }
  if (((byte)local_2f78.m_bit_flag & 0x61) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if (((flags >> 10 & 1) == 0) && ((local_2f78.m_method & 0xfff7) != 0)) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2f78.m_local_header_ofs,local_2f98,0x1e);
  if (sVar4 != 0x1e) {
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_2f98[0] != 0x4034b50) {
LAB_01201d6b:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  if (pZip->m_archive_size <
      local_2f78.m_local_header_ofs + local_2f7e + (ulong)local_2f7c + local_2f78.m_comp_size + 0x1e
     ) goto LAB_01201d6b;
  local_2fc8 = (ulong)local_2f7c + local_2f78.m_local_header_ofs + local_2f7e + 0x1e;
  pvVar1 = pZip->m_pState->m_pMem;
  mVar10 = local_2f78.m_comp_size;
  if (pvVar1 == (void *)0x0) {
    if (0xffff < local_2f78.m_comp_size) {
      mVar10 = 0x10000;
    }
    ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,mVar10);
    if (ptr == (mz_uint8 *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    mVar9 = 0;
    local_2fe8 = local_2f78.m_comp_size;
  }
  else {
    ptr = (mz_uint8 *)((long)pvVar1 + local_2fc8);
    mVar9 = local_2f78.m_comp_size;
    local_2fe8 = 0;
  }
  if (((flags >> 10 & 1) == 0) && (local_2f78.m_method != 0)) {
    local_2b28.m_state = 0;
    pOut_buf_start = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x8000);
    if (pOut_buf_start == (mz_uint8 *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      bVar14 = true;
      local_2ff0._0_4_ = 0;
      mVar12 = 0;
    }
    else {
      local_2ff0 = 0;
      local_2fe0 = 0;
      mVar12 = 0;
      do {
        uVar11 = (ulong)((uint)mVar12 & 0x7fff);
        local_2fb0 = 0x8000 - uVar11;
        if (mVar9 == 0) {
          if (pZip->m_pState->m_pMem != (void *)0x0) {
            mVar9 = 0;
            goto LAB_01201eca;
          }
          mVar9 = local_2fe8;
          if (mVar10 < local_2fe8) {
            mVar9 = mVar10;
          }
          sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2fc8,ptr,mVar9);
          if (sVar4 == mVar9) {
            local_2fc8 = local_2fc8 + mVar9;
            local_2fe8 = local_2fe8 - mVar9;
            local_2fe0 = 0;
            goto LAB_01201eca;
          }
          pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
LAB_01201fc2:
          bVar14 = false;
          uVar5 = 0xffffffff;
        }
        else {
LAB_01201eca:
          pOut_buf_next = pOut_buf_start + uVar11;
          local_2fa8 = mVar9;
          tVar3 = tinfl_decompress(&local_2b28,ptr + local_2fe0,&local_2fa8,pOut_buf_start,
                                   pOut_buf_next,&local_2fb0,(uint)(local_2fe8 != 0) * 2);
          sVar4 = local_2fb0;
          uVar5 = CONCAT44(extraout_var,tVar3);
          mVar9 = mVar9 - local_2fa8;
          local_2fe0 = local_2fa8 + local_2fe0;
          bVar14 = true;
          if (local_2fb0 != 0) {
            local_2fa0 = uVar5;
            sVar6 = (*pCallback)(pOpaque,mVar12,pOut_buf_next,local_2fb0);
            if (sVar6 == sVar4) {
              local_2ff0 = mz_crc32(local_2ff0 & 0xffffffff,pOut_buf_next,sVar4);
              mVar12 = mVar12 + sVar4;
              if (mVar12 <= local_2f78.m_uncomp_size) {
                bVar14 = true;
                uVar5 = local_2fa0;
                goto LAB_01201fe5;
              }
              pZip->m_last_error = MZ_ZIP_DECOMPRESSION_FAILED;
            }
            else {
              pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
            }
            goto LAB_01201fc2;
          }
        }
LAB_01201fe5:
      } while ((bVar14) && ((int)uVar5 - 1U < 2));
      bVar14 = (int)uVar5 != 0;
    }
  }
  else if (pZip->m_pState->m_pMem == (void *)0x0) {
    if (local_2fe8 == 0) {
      local_2ff0._0_4_ = 0;
      local_2f78.m_comp_size = 0;
LAB_01202182:
      pOut_buf_start = (mz_uint8 *)0x0;
      bVar14 = false;
      mVar12 = local_2f78.m_comp_size;
    }
    else {
      mVar12 = 0;
      local_2ff0 = 0;
      do {
        uVar11 = local_2fe8;
        if (mVar10 < local_2fe8) {
          uVar11 = mVar10;
        }
        sVar4 = (*pZip->m_pRead)(pZip->m_pIO_opaque,local_2fc8,ptr,uVar11);
        if (sVar4 != uVar11) {
          pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
LAB_01202196:
          bVar14 = true;
          goto LAB_012021a1;
        }
        if ((flags >> 10 & 1) == 0) {
          local_2ff0 = mz_crc32(local_2ff0 & 0xffffffff,ptr,uVar11);
        }
        sVar4 = (*pCallback)(pOpaque,mVar12,ptr,uVar11);
        if (sVar4 != uVar11) {
          pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
          goto LAB_01202196;
        }
        local_2fc8 = local_2fc8 + uVar11;
        mVar12 = mVar12 + uVar11;
        local_2fe8 = local_2fe8 - uVar11;
      } while (local_2fe8 != 0);
      bVar14 = false;
LAB_012021a1:
      pOut_buf_start = (mz_uint8 *)0x0;
    }
  }
  else {
    sVar4 = (*pCallback)(pOpaque,0,ptr,local_2f78.m_comp_size);
    mVar12 = local_2f78.m_comp_size;
    if (sVar4 == local_2f78.m_comp_size) {
      if ((flags >> 10 & 1) == 0) {
        mVar7 = mz_crc32(0,ptr,local_2f78.m_comp_size);
        local_2ff0._0_4_ = (mz_uint32)mVar7;
        goto LAB_01202182;
      }
      local_2ff0._0_4_ = 0;
      pOut_buf_start = (mz_uint8 *)0x0;
      bVar14 = false;
    }
    else {
      pZip->m_last_error = MZ_ZIP_WRITE_CALLBACK_FAILED;
      bVar14 = true;
      pOut_buf_start = (mz_uint8 *)0x0;
      local_2ff0._0_4_ = 0;
    }
  }
  uVar13 = (uint)(bVar14 ^ 1);
  if ((bVar14 == false) && ((flags & 0x400) == 0)) {
    mVar8 = MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE;
    if (mVar12 == local_2f78.m_uncomp_size) {
      mVar8 = MZ_ZIP_DECOMPRESSION_FAILED;
      uVar13 = 1;
      if ((mz_uint32)local_2ff0 == local_2f78.m_crc32) goto LAB_012021e5;
    }
    pZip->m_last_error = mVar8;
    uVar13 = 0;
  }
LAB_012021e5:
  if (pZip->m_pState->m_pMem == (void *)0x0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
  }
  if (pOut_buf_start != (mz_uint8 *)0x0) {
    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,pOut_buf_start);
    return uVar13;
  }
  return uVar13;
}

Assistant:

mz_bool mz_zip_reader_extract_to_callback(mz_zip_archive *pZip, mz_uint file_index, mz_file_write_func pCallback, void *pOpaque, mz_uint flags)
{
    int status = TINFL_STATUS_DONE;
    mz_uint file_crc32 = MZ_CRC32_INIT;
    mz_uint64 read_buf_size, read_buf_ofs = 0, read_buf_avail, comp_remaining, out_buf_ofs = 0, cur_file_ofs;
    mz_zip_archive_file_stat file_stat;
    void *pRead_buf = NULL;
    void *pWrite_buf = NULL;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;

    if ((!pZip) || (!pZip->m_pState) || (!pCallback) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (!mz_zip_reader_file_stat(pZip, file_index, &file_stat))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_comp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_bit_flag & (MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_IS_ENCRYPTED | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_USES_STRONG_ENCRYPTION | MZ_ZIP_GENERAL_PURPOSE_BIT_FLAG_COMPRESSED_PATCH_FLAG))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports decompressing stored and deflate. */
    if ((!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)) && (file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    /* Read and do some minimal validation of the local directory entry (this doesn't crack the zip64 stuff, which we already have from the central dir) */
    cur_file_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    cur_file_ofs += MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS) + MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    if ((cur_file_ofs + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    /* Decompress the file either directly from memory or from a file input buffer. */
    if (pZip->m_pState->m_pMem)
    {
        pRead_buf = (mz_uint8 *)pZip->m_pState->m_pMem + cur_file_ofs;
        read_buf_size = read_buf_avail = file_stat.m_comp_size;
        comp_remaining = 0;
    }
    else
    {
        read_buf_size = MZ_MIN(file_stat.m_comp_size, (mz_uint64)MZ_ZIP_MAX_IO_BUF_SIZE);
        if (NULL == (pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, (size_t)read_buf_size)))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

        read_buf_avail = 0;
        comp_remaining = file_stat.m_comp_size;
    }

    if ((flags & MZ_ZIP_FLAG_COMPRESSED_DATA) || (!file_stat.m_method))
    {
        /* The file is stored or the caller has requested the compressed data. */
        if (pZip->m_pState->m_pMem)
        {
            if (((sizeof(size_t) == sizeof(mz_uint32))) && (file_stat.m_comp_size > MZ_UINT32_MAX))
                return mz_zip_set_error(pZip, MZ_ZIP_INTERNAL_ERROR);

            if (pCallback(pOpaque, out_buf_ofs, pRead_buf, (size_t)file_stat.m_comp_size) != file_stat.m_comp_size)
            {
                mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                status = TINFL_STATUS_FAILED;
            }
            else if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
            {
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                file_crc32 = (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf, (size_t)file_stat.m_comp_size);
#endif
            }

            cur_file_ofs += file_stat.m_comp_size;
            out_buf_ofs += file_stat.m_comp_size;
            comp_remaining = 0;
        }
        else
        {
            while (comp_remaining)
            {
                read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
                if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                    status = TINFL_STATUS_FAILED;
                    break;
                }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                if (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA))
                {
                    file_crc32 = (mz_uint32)mz_crc32(file_crc32, (const mz_uint8 *)pRead_buf, (size_t)read_buf_avail);
                }
#endif

                if (pCallback(pOpaque, out_buf_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                    status = TINFL_STATUS_FAILED;
                    break;
                }

                cur_file_ofs += read_buf_avail;
                out_buf_ofs += read_buf_avail;
                comp_remaining -= read_buf_avail;
            }
        }
    }
    else
    {
        tinfl_decompressor inflator;
        tinfl_init(&inflator);

        if (NULL == (pWrite_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, TINFL_LZ_DICT_SIZE)))
        {
            mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            status = TINFL_STATUS_FAILED;
        }
        else
        {
            do
            {
                mz_uint8 *pWrite_buf_cur = (mz_uint8 *)pWrite_buf + (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
                size_t in_buf_size, out_buf_size = TINFL_LZ_DICT_SIZE - (out_buf_ofs & (TINFL_LZ_DICT_SIZE - 1));
                if ((!read_buf_avail) && (!pZip->m_pState->m_pMem))
                {
                    read_buf_avail = MZ_MIN(read_buf_size, comp_remaining);
                    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pRead_buf, (size_t)read_buf_avail) != read_buf_avail)
                    {
                        mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }
                    cur_file_ofs += read_buf_avail;
                    comp_remaining -= read_buf_avail;
                    read_buf_ofs = 0;
                }

                in_buf_size = (size_t)read_buf_avail;
                status = tinfl_decompress(&inflator, (const mz_uint8 *)pRead_buf + read_buf_ofs, &in_buf_size, (mz_uint8 *)pWrite_buf, pWrite_buf_cur, &out_buf_size, comp_remaining ? TINFL_FLAG_HAS_MORE_INPUT : 0);
                read_buf_avail -= in_buf_size;
                read_buf_ofs += in_buf_size;

                if (out_buf_size)
                {
                    if (pCallback(pOpaque, out_buf_ofs, pWrite_buf_cur, out_buf_size) != out_buf_size)
                    {
                        mz_zip_set_error(pZip, MZ_ZIP_WRITE_CALLBACK_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }

#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
                    file_crc32 = (mz_uint32)mz_crc32(file_crc32, pWrite_buf_cur, out_buf_size);
#endif
                    if ((out_buf_ofs += out_buf_size) > file_stat.m_uncomp_size)
                    {
                        mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
                        status = TINFL_STATUS_FAILED;
                        break;
                    }
                }
            } while ((status == TINFL_STATUS_NEEDS_MORE_INPUT) || (status == TINFL_STATUS_HAS_MORE_OUTPUT));
        }
    }

    if ((status == TINFL_STATUS_DONE) && (!(flags & MZ_ZIP_FLAG_COMPRESSED_DATA)))
    {
        /* Make sure the entire file was decompressed, and check its CRC. */
        if (out_buf_ofs != file_stat.m_uncomp_size)
        {
            mz_zip_set_error(pZip, MZ_ZIP_UNEXPECTED_DECOMPRESSED_SIZE);
            status = TINFL_STATUS_FAILED;
        }
#ifndef MINIZ_DISABLE_ZIP_READER_CRC32_CHECKS
        else if (file_crc32 != file_stat.m_crc32)
        {
            mz_zip_set_error(pZip, MZ_ZIP_DECOMPRESSION_FAILED);
            status = TINFL_STATUS_FAILED;
        }
#endif
    }

    if (!pZip->m_pState->m_pMem)
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);

    if (pWrite_buf)
        pZip->m_pFree(pZip->m_pAlloc_opaque, pWrite_buf);

    return status == TINFL_STATUS_DONE;
}